

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

char * QUtf8::convertFromUnicode(char *out,QStringView in,State *state)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char cVar3;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [12];
  bool bVar21;
  ushort uVar22;
  int iVar23;
  qsizetype qVar24;
  const_pointer pvVar25;
  long in_RCX;
  uchar *puVar26;
  uchar **in_RDI;
  long in_FS_OFFSET;
  int res;
  char16_t *end;
  qsizetype len;
  int res_1;
  char16_t u;
  char16_t *end_1;
  qsizetype len_1;
  uchar n_3;
  __m128i nonAscii_1;
  __m128i packed_1;
  __m128i data2_1;
  __m128i data1;
  uchar n_2;
  __m128i nonAscii;
  __m128i packed;
  __m128i data2;
  __m128i data;
  ushort n;
  ushort n_1;
  qptrdiff offset;
  size_t Step;
  size_t size_1;
  size_t size;
  char16_t *src;
  uchar *cursor;
  anon_class_8_1_a8a4b3b1 appendReplacementChar;
  char16_t *nextAscii;
  char16_t *src_1;
  uchar *dst;
  anon_class_32_4_847b04ed adjustToEnd;
  anon_class_32_4_99005a4f maybeFoundNonAscii;
  anon_class_1_0_00000001 process16Chars;
  size_t sizeBytes;
  undefined4 in_stack_fffffffffffffb68;
  Flag in_stack_fffffffffffffb6c;
  QStringView *in_stack_fffffffffffffb70;
  uchar **in_stack_fffffffffffffb78;
  uchar **ppuVar27;
  uchar **dst_00;
  uchar n_00;
  undefined2 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb82;
  undefined1 in_stack_fffffffffffffb83;
  int in_stack_fffffffffffffb84;
  uchar **local_460;
  undefined8 local_428;
  undefined4 uStack_420;
  undefined4 local_418;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  long local_388;
  bool local_359;
  short local_278;
  short sStack_276;
  short sStack_274;
  short sStack_272;
  short sStack_270;
  short sStack_26e;
  short sStack_26c;
  short sStack_26a;
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  short sStack_250;
  short sStack_24e;
  short sStack_24c;
  short sStack_24a;
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  QFlagsStorageHelper<QStringConverter::Flag,_4> local_c8;
  QFlagsStorageHelper<QStringConverter::Flag,_4> local_c4;
  storage_type_conflict *local_c0;
  uchar **local_b8;
  long local_b0;
  long local_a8;
  QStringView local_a0;
  const_pointer local_90;
  const_pointer local_88;
  uchar **local_80;
  QStringView local_78;
  anon_class_32_4_847b04ed local_68;
  const_pointer *local_48;
  uchar ***local_40;
  const_pointer *local_38;
  const_pointer *local_30;
  anon_class_1_0_00000001 local_21;
  ulong local_20;
  const_pointer local_18;
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8 = in_RCX;
  qVar24 = QStringView::size(&local_a0);
  local_460 = in_RDI;
  if (qVar24 != 0) {
    local_b0 = local_a8;
    local_b8 = in_RDI;
    local_c0 = QStringView::utf16(&local_a0);
    local_c4.super_QFlagsStorage<QStringConverter::Flag>.i =
         (QFlagsStorage<QStringConverter::Flag>)
         QFlags<QStringConverter::Flag>::operator&
                   ((QFlags<QStringConverter::Flag> *)in_stack_fffffffffffffb70,
                    in_stack_fffffffffffffb6c);
    bVar21 = ::QFlags::operator_cast_to_bool((QFlags *)&local_c4);
    if (((bVar21 ^ 0xffU) & 1) != 0) {
      if (*(long *)(local_a8 + 8) == 0) {
        in_stack_fffffffffffffb83 = false;
        if ((*(uint *)(local_a8 + 4) & 1) == 0) {
          local_c8.super_QFlagsStorage<QStringConverter::Flag>.i =
               (QFlagsStorage<QStringConverter::Flag>)
               QFlags<QStringConverter::Flag>::operator&
                         ((QFlags<QStringConverter::Flag> *)in_stack_fffffffffffffb70,
                          in_stack_fffffffffffffb6c);
          in_stack_fffffffffffffb83 = ::QFlags::operator_cast_to_bool((QFlags *)&local_c8);
        }
        if ((bool)in_stack_fffffffffffffb83 != false) {
          *(uchar *)local_b8 = 0xef;
          puVar26 = (uchar *)((long)local_b8 + 2);
          *(uchar *)((long)local_b8 + 1) = 0xbb;
          local_b8 = (uchar **)((long)local_b8 + 3);
          *puVar26 = 0xbf;
          *(uint *)(local_a8 + 4) = *(uint *)(local_a8 + 4) | 1;
        }
      }
      else {
        in_stack_fffffffffffffb84 =
             QUtf8Functions::toUtf8<QUtf8BaseTraits,unsigned_char*,char16_t_const*>
                       (CONCAT11(in_stack_fffffffffffffb83,in_stack_fffffffffffffb82),
                        in_stack_fffffffffffffb78,&in_stack_fffffffffffffb70->m_data,
                        (char16_t *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
        if (in_stack_fffffffffffffb84 < 0) {
          local_b8 = (uchar **)
                     convertFromUnicode::anon_class_8_1_a8a4b3b1::operator()
                               ((anon_class_8_1_a8a4b3b1 *)in_stack_fffffffffffffb70,
                                (uchar *)CONCAT44(in_stack_fffffffffffffb6c,
                                                  in_stack_fffffffffffffb68));
        }
        *(undefined4 *)(local_a8 + 0x18) = 0;
        *(undefined8 *)(local_a8 + 8) = 0;
      }
    }
    ppuVar27 = local_b8;
    QStringView::QStringView<char16_t,_true>
              (in_stack_fffffffffffffb70,
               (char16_t *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               L"譈⑄䠐貍\xf024\x03䠀貉뀤\x03䠀貍\xe824\x03䠀貉려\x03䠀钋쀤\x03䠀貋젤\x03䠀钉․\x04䠀貉⠤\x04䠀䒉怤赈⒄ΰ"
              );
    dst_00 = ppuVar27;
    qVar24 = QStringView::size(&local_78);
    local_80 = ppuVar27;
    local_88 = QStringView::data(&local_78);
    pvVar25 = local_88 + qVar24;
    while (local_88 != pvVar25) {
      local_68.dst = (uchar **)&local_80;
      local_38 = &local_90;
      local_68.src = (char16_t **)&local_88;
      local_20 = (long)pvVar25 - (long)local_88;
      local_21 = (anon_class_1_0_00000001)0xaa;
      local_30 = &local_18;
      local_68.sizeBytes = &local_20;
      local_68.end = (char16_t **)&local_18;
      local_90 = pvVar25;
      local_48 = (const_pointer *)local_68.src;
      local_40 = (uchar ***)local_68.dst;
      local_18 = pvVar25;
      if (local_20 < 0x20) {
        n_00 = (uchar)((ulong)dst_00 >> 0x38);
        if (local_20 < 0x10) {
          if (local_20 < 8) {
            local_359 = local_88 == pvVar25;
          }
          else {
            uVar1 = *(undefined8 *)local_88;
            uVar2 = *(undefined8 *)(pvVar25 + -4);
            local_218 = (short)uVar1;
            sStack_216 = (short)((ulong)uVar1 >> 0x10);
            sStack_214 = (short)((ulong)uVar1 >> 0x20);
            sStack_212 = (short)((ulong)uVar1 >> 0x30);
            cVar8 = (0 < local_218) * (local_218 < 0x100) * (char)uVar1 - (0xff < local_218);
            cVar7 = (char)((ulong)uVar1 >> 0x10);
            cVar9 = (0 < sStack_216) * (sStack_216 < 0x100) * cVar7 - (0xff < sStack_216);
            cVar6 = (char)((ulong)uVar1 >> 0x20);
            cVar10 = (0 < sStack_214) * (sStack_214 < 0x100) * cVar6 - (0xff < sStack_214);
            cVar5 = (char)((ulong)uVar1 >> 0x30);
            cVar4 = (0 < sStack_212) * (sStack_212 < 0x100) * cVar5 - (0xff < sStack_212);
            local_418._0_2_ = CONCAT11(cVar9,cVar8);
            local_418._0_3_ = CONCAT12(cVar10,(undefined2)local_418);
            local_418 = CONCAT13(cVar4,(undefined3)local_418);
            local_428 = CONCAT44(0,CONCAT13(-('\0' < cVar4),
                                            CONCAT12(-('\0' < cVar10),
                                                     CONCAT11(-('\0' < cVar9),-('\0' < cVar8)))));
            uStack_420 = CONCAT13(-('\0' < (char)((0 < sStack_212) * (sStack_212 < 0x100) * cVar5 -
                                                 (0xff < sStack_212))),
                                  CONCAT12(-('\0' < (char)((0 < sStack_214) * (sStack_214 < 0x100) *
                                                           cVar6 - (0xff < sStack_214))),
                                           CONCAT11(-('\0' < (char)((0 < sStack_216) *
                                                                    (sStack_216 < 0x100) * cVar7 -
                                                                   (0xff < sStack_216))),
                                                    -('\0' < (char)((0 < local_218) *
                                                                    (local_218 < 0x100) *
                                                                    (char)uVar1 - (0xff < local_218)
                                                                   )))));
            local_c = local_418;
            *(undefined4 *)local_80 = local_418;
            auVar20._8_4_ = uStack_420;
            auVar20._0_8_ = local_428;
            if ((byte)(SUB121(auVar20 >> 7,0) & 1 | (SUB121(auVar20 >> 0xf,0) & 1) << 1 |
                       (SUB121(auVar20 >> 0x17,0) & 1) << 2 | SUB121(auVar20 >> 0x1f,0) << 3) == 0xf
               ) {
              simdEncodeAscii<1UL>::anon_class_32_4_847b04ed::operator()(&local_68);
              local_238 = (short)uVar2;
              sStack_236 = (short)((ulong)uVar2 >> 0x10);
              sStack_234 = (short)((ulong)uVar2 >> 0x20);
              sStack_232 = (short)((ulong)uVar2 >> 0x30);
              local_418._0_2_ =
                   CONCAT11((0 < sStack_236) * (sStack_236 < 0x100) * (char)((ulong)uVar2 >> 0x10) -
                            (0xff < sStack_236),
                            (0 < local_238) * (local_238 < 0x100) * (char)uVar2 - (0xff < local_238)
                           );
              local_418._0_3_ =
                   CONCAT12((0 < sStack_234) * (sStack_234 < 0x100) * (char)((ulong)uVar2 >> 0x20) -
                            (0xff < sStack_234),(undefined2)local_418);
              local_418 = CONCAT13((0 < sStack_232) * (sStack_232 < 0x100) *
                                   (char)((ulong)uVar2 >> 0x30) - (0xff < sStack_232),
                                   (undefined3)local_418);
              local_10 = local_418;
              *(undefined4 *)((long)local_80 + -4) = local_418;
              local_359 = simdEncodeAscii<1ul>(unsigned_char*&,char16_t_const*&,char16_t_const*&,char16_t_const*)
                          ::{lambda(auto:1,long_long)#1}::operator()
                                    ((anon_class_32_4_99005a4f *)
                                     CONCAT44(in_stack_fffffffffffffb84,
                                              CONCAT13(in_stack_fffffffffffffb83,
                                                       CONCAT12(in_stack_fffffffffffffb82,
                                                                in_stack_fffffffffffffb80))),
                                     (uchar)((ulong)dst_00 >> 0x38),
                                     (qptrdiff)in_stack_fffffffffffffb70);
            }
            else {
              local_359 = simdEncodeAscii<1ul>(unsigned_char*&,char16_t_const*&,char16_t_const*&,char16_t_const*)
                          ::{lambda(auto:1,long_long)#1}::operator()
                                    ((anon_class_32_4_99005a4f *)
                                     CONCAT44(in_stack_fffffffffffffb84,
                                              CONCAT13(in_stack_fffffffffffffb83,
                                                       CONCAT12(in_stack_fffffffffffffb82,
                                                                in_stack_fffffffffffffb80))),n_00,
                                     (qptrdiff)in_stack_fffffffffffffb70);
            }
          }
        }
        else {
          uVar1 = *(undefined8 *)local_88;
          uVar2 = *(undefined8 *)(local_88 + 4);
          uVar17 = *(undefined8 *)(pvVar25 + -8);
          uVar18 = *(undefined8 *)(pvVar25 + -4);
          local_258 = (short)uVar1;
          sStack_256 = (short)((ulong)uVar1 >> 0x10);
          sStack_254 = (short)((ulong)uVar1 >> 0x20);
          sStack_252 = (short)((ulong)uVar1 >> 0x30);
          sStack_250 = (short)uVar2;
          sStack_24e = (short)((ulong)uVar2 >> 0x10);
          sStack_24c = (short)((ulong)uVar2 >> 0x20);
          sStack_24a = (short)((ulong)uVar2 >> 0x30);
          cVar3 = (0 < local_258) * (local_258 < 0x100) * (char)uVar1 - (0xff < local_258);
          cVar11 = (char)((ulong)uVar1 >> 0x10);
          cVar4 = (0 < sStack_256) * (sStack_256 < 0x100) * cVar11 - (0xff < sStack_256);
          cVar12 = (char)((ulong)uVar1 >> 0x20);
          cVar5 = (0 < sStack_254) * (sStack_254 < 0x100) * cVar12 - (0xff < sStack_254);
          cVar13 = (char)((ulong)uVar1 >> 0x30);
          cVar6 = (0 < sStack_252) * (sStack_252 < 0x100) * cVar13 - (0xff < sStack_252);
          cVar7 = (0 < sStack_250) * (sStack_250 < 0x100) * (char)uVar2 - (0xff < sStack_250);
          cVar14 = (char)((ulong)uVar2 >> 0x10);
          cVar8 = (0 < sStack_24e) * (sStack_24e < 0x100) * cVar14 - (0xff < sStack_24e);
          cVar15 = (char)((ulong)uVar2 >> 0x20);
          cVar9 = (0 < sStack_24c) * (sStack_24c < 0x100) * cVar15 - (0xff < sStack_24c);
          cVar16 = (char)((ulong)uVar2 >> 0x30);
          cVar10 = (0 < sStack_24a) * (sStack_24a < 0x100) * cVar16 - (0xff < sStack_24a);
          local_3c8._0_2_ = CONCAT11(cVar4,cVar3);
          local_3c8._0_3_ = CONCAT12(cVar5,(undefined2)local_3c8);
          local_3c8._0_4_ = CONCAT13(cVar6,(undefined3)local_3c8);
          local_3c8._0_5_ = CONCAT14(cVar7,(undefined4)local_3c8);
          local_3c8._0_6_ = CONCAT15(cVar8,(undefined5)local_3c8);
          local_3c8._0_7_ = CONCAT16(cVar9,(undefined6)local_3c8);
          local_3c8 = (uchar *)CONCAT17(cVar10,(undefined7)local_3c8);
          local_3d8 = CONCAT17(-('\0' < cVar10),
                               CONCAT16(-('\0' < cVar9),
                                        CONCAT15(-('\0' < cVar8),
                                                 CONCAT14(-('\0' < cVar7),
                                                          CONCAT13(-('\0' < cVar6),
                                                                   CONCAT12(-('\0' < cVar5),
                                                                            CONCAT11(-('\0' < cVar4)
                                                                                     ,-('\0' < cVar3
                                                                                       ))))))));
          uStack_3d0 = CONCAT17(-('\0' < (char)((0 < sStack_24a) * (sStack_24a < 0x100) * cVar16 -
                                               (0xff < sStack_24a))),
                                CONCAT16(-('\0' < (char)((0 < sStack_24c) * (sStack_24c < 0x100) *
                                                         cVar15 - (0xff < sStack_24c))),
                                         CONCAT15(-('\0' < (char)((0 < sStack_24e) *
                                                                  (sStack_24e < 0x100) * cVar14 -
                                                                 (0xff < sStack_24e))),
                                                  CONCAT14(-('\0' < (char)((0 < sStack_250) *
                                                                           (sStack_250 < 0x100) *
                                                                           (char)uVar2 -
                                                                          (0xff < sStack_250))),
                                                           CONCAT13(-('\0' < (char)((0 < sStack_252)
                                                                                    * (sStack_252 <
                                                                                      0x100) *
                                                                                    cVar13 - (0xff <
                                                                                                                                                                                          
                                                  sStack_252))),
                                                  CONCAT12(-('\0' < (char)((0 < sStack_254) *
                                                                           (sStack_254 < 0x100) *
                                                                           cVar12 - (0xff < 
                                                  sStack_254))),
                                                  CONCAT11(-('\0' < (char)((0 < sStack_256) *
                                                                           (sStack_256 < 0x100) *
                                                                           cVar11 - (0xff < 
                                                  sStack_256))),
                                                  -('\0' < (char)((0 < local_258) *
                                                                  (local_258 < 0x100) * (char)uVar1
                                                                 - (0xff < local_258))))))))));
          *local_80 = local_3c8;
          auVar19._8_8_ = uStack_3d0;
          auVar19._0_8_ = local_3d8;
          if ((byte)(SUB161(auVar19 >> 7,0) & 1 | (SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                     (SUB161(auVar19 >> 0x17,0) & 1) << 2 | (SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                     (SUB161(auVar19 >> 0x27,0) & 1) << 4 | (SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                     (SUB161(auVar19 >> 0x37,0) & 1) << 6 | SUB161(auVar19 >> 0x3f,0) << 7) == 0xff)
          {
            simdEncodeAscii<1UL>::anon_class_32_4_847b04ed::operator()(&local_68);
            local_278 = (short)uVar17;
            sStack_276 = (short)((ulong)uVar17 >> 0x10);
            sStack_274 = (short)((ulong)uVar17 >> 0x20);
            sStack_272 = (short)((ulong)uVar17 >> 0x30);
            sStack_270 = (short)uVar18;
            sStack_26e = (short)((ulong)uVar18 >> 0x10);
            sStack_26c = (short)((ulong)uVar18 >> 0x20);
            sStack_26a = (short)((ulong)uVar18 >> 0x30);
            local_3c8._0_2_ =
                 CONCAT11((0 < sStack_276) * (sStack_276 < 0x100) * (char)((ulong)uVar17 >> 0x10) -
                          (0xff < sStack_276),
                          (0 < local_278) * (local_278 < 0x100) * (char)uVar17 - (0xff < local_278))
            ;
            local_3c8._0_3_ =
                 CONCAT12((0 < sStack_274) * (sStack_274 < 0x100) * (char)((ulong)uVar17 >> 0x20) -
                          (0xff < sStack_274),(undefined2)local_3c8);
            local_3c8._0_4_ =
                 CONCAT13((0 < sStack_272) * (sStack_272 < 0x100) * (char)((ulong)uVar17 >> 0x30) -
                          (0xff < sStack_272),(undefined3)local_3c8);
            local_3c8._0_5_ =
                 CONCAT14((0 < sStack_270) * (sStack_270 < 0x100) * (char)uVar18 -
                          (0xff < sStack_270),(undefined4)local_3c8);
            local_3c8._0_6_ =
                 CONCAT15((0 < sStack_26e) * (sStack_26e < 0x100) * (char)((ulong)uVar18 >> 0x10) -
                          (0xff < sStack_26e),(undefined5)local_3c8);
            local_3c8._0_7_ =
                 CONCAT16((0 < sStack_26c) * (sStack_26c < 0x100) * (char)((ulong)uVar18 >> 0x20) -
                          (0xff < sStack_26c),(undefined6)local_3c8);
            local_3c8 = (uchar *)CONCAT17((0 < sStack_26a) * (sStack_26a < 0x100) *
                                          (char)((ulong)uVar18 >> 0x30) - (0xff < sStack_26a),
                                          (undefined7)local_3c8);
            local_80[-1] = local_3c8;
            local_359 = simdEncodeAscii<1ul>(unsigned_char*&,char16_t_const*&,char16_t_const*&,char16_t_const*)
                        ::{lambda(auto:1,long_long)#1}::operator()
                                  ((anon_class_32_4_99005a4f *)
                                   CONCAT44(in_stack_fffffffffffffb84,
                                            CONCAT13(in_stack_fffffffffffffb83,
                                                     CONCAT12(in_stack_fffffffffffffb82,
                                                              in_stack_fffffffffffffb80))),
                                   (uchar)((ulong)dst_00 >> 0x38),
                                   (qptrdiff)in_stack_fffffffffffffb70);
          }
          else {
            local_359 = simdEncodeAscii<1ul>(unsigned_char*&,char16_t_const*&,char16_t_const*&,char16_t_const*)
                        ::{lambda(auto:1,long_long)#1}::operator()
                                  ((anon_class_32_4_99005a4f *)
                                   CONCAT44(in_stack_fffffffffffffb84,
                                            CONCAT13(in_stack_fffffffffffffb83,
                                                     CONCAT12(in_stack_fffffffffffffb82,
                                                              in_stack_fffffffffffffb80))),n_00,
                                   (qptrdiff)in_stack_fffffffffffffb70);
          }
        }
      }
      else {
        for (local_388 = 0; (ulong)((local_388 + 0x10) * 2) < local_20; local_388 = local_388 + 0x10
            ) {
          uVar22 = simdEncodeAscii<1UL>::anon_class_1_0_00000001::operator()
                             (&local_21,(uchar *)((long)local_80 + local_388),
                              &local_88[local_388].ucs);
          if (uVar22 != 0) {
            local_359 = simdEncodeAscii<1ul>(unsigned_char*&,char16_t_const*&,char16_t_const*&,char16_t_const*)
                        ::{lambda(auto:1,long_long)#1}::operator()
                                  ((anon_class_32_4_99005a4f *)
                                   CONCAT44(in_stack_fffffffffffffb84,
                                            CONCAT13(in_stack_fffffffffffffb83,
                                                     CONCAT12(in_stack_fffffffffffffb82,
                                                              in_stack_fffffffffffffb80))),
                                   (unsigned_short)((ulong)dst_00 >> 0x30),
                                   (qptrdiff)in_stack_fffffffffffffb70);
            goto LAB_001e8f37;
          }
        }
        simdEncodeAscii<1UL>::anon_class_32_4_847b04ed::operator()(&local_68);
        simdEncodeAscii<1UL>::anon_class_1_0_00000001::operator()
                  (&local_21,(uchar *)(local_80 + -2),&local_88[-0x10].ucs);
        local_359 = simdEncodeAscii<1ul>(unsigned_char*&,char16_t_const*&,char16_t_const*&,char16_t_const*)
                    ::{lambda(auto:1,long_long)#1}::operator()
                              ((anon_class_32_4_99005a4f *)
                               CONCAT44(in_stack_fffffffffffffb84,
                                        CONCAT13(in_stack_fffffffffffffb83,
                                                 CONCAT12(in_stack_fffffffffffffb82,
                                                          in_stack_fffffffffffffb80))),
                               (unsigned_short)((ulong)dst_00 >> 0x30),
                               (qptrdiff)in_stack_fffffffffffffb70);
      }
LAB_001e8f37:
      if (local_359 != false) break;
      do {
        local_88 = local_88 + 1;
        iVar23 = QUtf8Functions::toUtf8<QUtf8BaseTraits,unsigned_char*,char16_t_const*>
                           (CONCAT11(in_stack_fffffffffffffb83,in_stack_fffffffffffffb82),dst_00,
                            &in_stack_fffffffffffffb70->m_data,
                            (char16_t *)
                            CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
        if (iVar23 < 0) {
          convertFromUnicode::anon_class_16_2_1a60e786::operator()
                    ((anon_class_16_2_1a60e786 *)
                     CONCAT44(in_stack_fffffffffffffb84,
                              CONCAT13(in_stack_fffffffffffffb83,
                                       CONCAT12(in_stack_fffffffffffffb82,in_stack_fffffffffffffb80)
                                      )),dst_00,(char16_t)((ulong)in_stack_fffffffffffffb70 >> 0x30)
                     ,(int)in_stack_fffffffffffffb70);
        }
      } while (local_88 < local_90);
    }
    local_460 = local_80;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (char *)local_460;
}

Assistant:

char *QUtf8::convertFromUnicode(char *out, QStringView in, QStringConverter::State *state)
{
    Q_ASSERT(state);
    qsizetype len = in.size();
    if (!len)
        return out;

    auto appendReplacementChar = [state](uchar *cursor) -> uchar * {
        if (state->flags & QStringConverter::Flag::ConvertInvalidToNull) {
            *cursor++ = 0;
        } else {
            // QChar::replacement encoded in utf8
            *cursor++ = 0xef;
            *cursor++ = 0xbf;
            *cursor++ = 0xbd;
        }
        return cursor;
    };

    uchar *cursor = reinterpret_cast<uchar *>(out);
    const char16_t *src = in.utf16();
    const char16_t *const end = src + len;

    if (!(state->flags & QStringDecoder::Flag::Stateless)) {
        if (state->remainingChars) {
            int res = QUtf8Functions::toUtf8<QUtf8BaseTraits>(state->state_data[0], cursor, src, end);
            if (res < 0)
                cursor = appendReplacementChar(cursor);
            state->state_data[0] = 0;
            state->remainingChars = 0;
        } else if (!(state->internalState & HeaderDone) && state->flags & QStringConverter::Flag::WriteBom) {
            // append UTF-8 BOM
            *cursor++ = utf8bom[0];
            *cursor++ = utf8bom[1];
            *cursor++ = utf8bom[2];
            state->internalState |= HeaderDone;
        }
    }

    out = reinterpret_cast<char *>(cursor);
    return convertFromUnicode(out, { src, end }, [&](uchar *&cursor, char16_t uc, int res) {
        if (res == QUtf8BaseTraits::Error) {
            // encoding error
            ++state->invalidChars;
            cursor = appendReplacementChar(cursor);
        } else if (res == QUtf8BaseTraits::EndOfString) {
            if (state->flags & QStringConverter::Flag::Stateless) {
                ++state->invalidChars;
                cursor = appendReplacementChar(cursor);
            } else {
                state->remainingChars = 1;
                state->state_data[0] = uc;
            }
        }
    });
}